

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::EventType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::EventType,_std::allocator<wabt::SharedValidator::EventType>_>
          *values,EventType *out,char *desc)

{
  Result RVar1;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_98;
  Var local_78;
  
  Var::Var(&local_78,var);
  RVar1 = CheckIndex(this,&local_78,
                     (int)((ulong)((long)(values->
                                         super__Vector_base<wabt::SharedValidator::EventType,_std::allocator<wabt::SharedValidator::EventType>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(values->
                                        super__Vector_base<wabt::SharedValidator::EventType,_std::allocator<wabt::SharedValidator::EventType>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555,desc);
  Var::~Var(&local_78);
  if (out != (EventType *)0x0) {
    if (RVar1.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h"
                      ,0x38,"Index wabt::Var::index() const");
      }
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_98,
                 &(values->
                  super__Vector_base<wabt::SharedValidator::EventType,_std::allocator<wabt::SharedValidator::EventType>_>
                  )._M_impl.super__Vector_impl_data._M_start[(var->field_2).index_].params);
    }
    else {
      local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(&out->params,&local_98);
    if (local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}